

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

void HashmapSortRehash(jx9_hashmap *pMap)

{
  uint local_24;
  jx9_hashmap_node *pjStack_20;
  sxu32 i;
  jx9_hashmap_node *pLast;
  jx9_hashmap_node *p;
  jx9_hashmap *pMap_local;
  
  pjStack_20 = pMap->pFirst;
  pMap->iNextIdx = 0;
  pLast = pjStack_20;
  for (local_24 = 0; local_24 < pMap->nEntry; local_24 = local_24 + 1) {
    if (pLast->iType == 2) {
      SyBlobRelease(&(pLast->xKey).sKey);
      pLast->iType = 1;
    }
    HashmapRehashIntNode(pLast);
    pjStack_20 = pLast;
    pLast = pLast->pPrev;
  }
  pMap->pLast = pjStack_20;
  return;
}

Assistant:

static void HashmapSortRehash(jx9_hashmap *pMap)
{
	jx9_hashmap_node *p, *pLast;
	sxu32 i;
	/* Rehash all entries */
	pLast = p = pMap->pFirst;
	pMap->iNextIdx = 0; /* Reset the automatic index */
	i = 0;
	for( ;; ){
		if( i >= pMap->nEntry ){
			pMap->pLast = pLast; /* Fix the last link broken by the merge-sort */
			break;
		}
		if( p->iType == HASHMAP_BLOB_NODE ){
			/* Do not maintain index association as requested by the JX9 specification */
			SyBlobRelease(&p->xKey.sKey);
			/* Change key type */
			p->iType = HASHMAP_INT_NODE;
		}
		HashmapRehashIntNode(p);
		/* Point to the next entry */
		i++;
		pLast = p;
		p = p->pPrev; /* Reverse link */
	}
}